

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O1

int mbedtls_entropy_add_source
              (mbedtls_entropy_context *ctx,mbedtls_entropy_f_source_ptr f_source,void *p_source,
              size_t threshold,int strong)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = ctx->source_count;
  lVar3 = (long)iVar1;
  iVar2 = -0x3e;
  if (lVar3 < 0x14) {
    ctx->source[lVar3].f_source = f_source;
    ctx->source[lVar3].p_source = p_source;
    ctx->source[lVar3].threshold = threshold;
    ctx->source[lVar3].strong = strong;
    ctx->source_count = iVar1 + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_entropy_add_source( mbedtls_entropy_context *ctx,
                        mbedtls_entropy_f_source_ptr f_source, void *p_source,
                        size_t threshold, int strong )
{
    int index, ret = 0;

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    index = ctx->source_count;
    if( index >= MBEDTLS_ENTROPY_MAX_SOURCES )
    {
        ret = MBEDTLS_ERR_ENTROPY_MAX_SOURCES;
        goto exit;
    }

    ctx->source[index].f_source  = f_source;
    ctx->source[index].p_source  = p_source;
    ctx->source[index].threshold = threshold;
    ctx->source[index].strong    = strong;

    ctx->source_count++;

exit:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}